

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

uint implementations::scheme::do_scheme_complete_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  environment *this_00;
  ostream *poVar6;
  size_t __nbytes;
  cell *exp;
  size_t __nbytes_00;
  cell *exp_00;
  size_t __nbytes_01;
  cell *exp_01;
  size_t __nbytes_02;
  cell *exp_02;
  size_t __nbytes_03;
  cell *exp_03;
  size_t __nbytes_04;
  cell *exp_04;
  size_t __nbytes_05;
  cell *exp_05;
  size_t __nbytes_06;
  cell *exp_06;
  size_t __nbytes_07;
  cell *exp_07;
  size_t __nbytes_08;
  cell *exp_08;
  size_t __nbytes_09;
  cell *exp_09;
  size_t __nbytes_10;
  cell *exp_10;
  size_t __nbytes_11;
  cell *exp_11;
  size_t __nbytes_12;
  cell *exp_12;
  size_t __nbytes_13;
  cell *exp_13;
  size_t __nbytes_14;
  cell *exp_14;
  size_t __nbytes_15;
  cell *exp_15;
  size_t __nbytes_16;
  cell *exp_16;
  size_t __nbytes_17;
  cell *exp_17;
  size_t __nbytes_18;
  cell *exp_18;
  size_t __nbytes_19;
  cell *exp_19;
  size_t __nbytes_20;
  cell *exp_20;
  size_t __nbytes_21;
  cell *exp_21;
  size_t __nbytes_22;
  cell *exp_22;
  size_t __nbytes_23;
  cell *exp_23;
  size_t __nbytes_24;
  cell *exp_24;
  size_t __nbytes_25;
  cell *exp_25;
  size_t __nbytes_26;
  cell *exp_26;
  size_t __nbytes_27;
  cell *exp_27;
  env_p global_env;
  long *local_338 [2];
  long local_328 [2];
  string local_318;
  string local_2f8;
  environment *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  cell local_2c8;
  cell local_270;
  env_p local_218;
  env_p local_208;
  env_p local_1f8;
  env_p local_1e8;
  env_p local_1d8;
  env_p local_1c8;
  env_p local_1b8;
  env_p local_1a8;
  env_p local_198;
  env_p local_188;
  env_p local_178;
  env_p local_168;
  env_p local_158;
  env_p local_148;
  env_p local_138;
  env_p local_128;
  env_p local_118;
  env_p local_108;
  env_p local_f8;
  env_p local_e8;
  env_p local_d8;
  env_p local_c8;
  env_p local_b8;
  env_p local_a8;
  env_p local_98;
  env_p local_88;
  env_p local_78;
  env_p local_68;
  env_p local_58;
  env_p local_48;
  
  this_00 = (environment *)operator_new(0x98);
  local_48.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  environment::environment(this_00,&local_48);
  local_2d8 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<implementations::scheme::environment*>(&local_2d0,this_00);
  if (local_48.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  add_globals(local_2d8);
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  paVar1 = &local_318.field_2;
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(quote (testing 1 (2.0) -3.14e159))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(quote (testing 1 (2.0) -3.14e159))","");
  read((int)&local_2c8,local_338,__nbytes);
  local_58.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_58.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_58);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp);
  test_equal_<std::__cxx11::string,char[28]>
            (&local_318,&local_2f8,(char (*) [28])"(testing 1 (2.0) -3.14e159)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x31e);
  paVar2 = &local_2f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  paVar3 = &local_270.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_58.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  paVar4 = &local_2c8.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(+ 2 2)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(+ 2 2)","");
  read((int)&local_2c8,local_338,__nbytes_00);
  local_68.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_68.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_68);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_00);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,799);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_68.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(+ (* 2 100) (* 1 10))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(+ (* 2 100) (* 1 10))","");
  read((int)&local_2c8,local_338,__nbytes_01);
  local_78.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_78.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_78);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_01);
  test_equal_<std::__cxx11::string,char[4]>
            (&local_318,&local_2f8,(char (*) [4])"210",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_78.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(if (> 6 5) (+ 1 1) (+ 2 2))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(if (> 6 5) (+ 1 1) (+ 2 2))","");
  read((int)&local_2c8,local_338,__nbytes_02);
  local_88.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_88.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_88);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_02);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x321);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_88.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(if (< 6 5) (+ 1 1) (+ 2 2))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(if (< 6 5) (+ 1 1) (+ 2 2))","");
  read((int)&local_2c8,local_338,__nbytes_03);
  local_98.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_98.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_98);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_03);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x322);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_98.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(define x 3)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(define x 3)","");
  read((int)&local_2c8,local_338,__nbytes_04);
  local_a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_a8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_04);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x323);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"x","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"x","");
  read((int)&local_2c8,local_338,__nbytes_05);
  local_b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_b8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_05);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x324);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(+ x x)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(+ x x)","");
  read((int)&local_2c8,local_338,__nbytes_06);
  local_c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_c8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_06);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x325);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))","");
  read((int)&local_2c8,local_338,__nbytes_07);
  local_d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_d8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_07);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x326);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"((lambda (x) (+ x x)) 5)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"((lambda (x) (+ x x)) 5)","")
  ;
  read((int)&local_2c8,local_338,__nbytes_08);
  local_e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_e8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_08);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_318,&local_2f8,(char (*) [3])0x1280f5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x327);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define twice (lambda (x) (* 2 x)))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define twice (lambda (x) (* 2 x)))","");
  read((int)&local_2c8,local_338,__nbytes_09);
  local_f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_f8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_09);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(twice 5)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(twice 5)","");
  read((int)&local_2c8,local_338,__nbytes_10);
  local_108.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_108.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_108);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_10);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_318,&local_2f8,(char (*) [3])0x1280f5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x329);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_108.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define compose (lambda (f g) (lambda (x) (f (g x)))))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define compose (lambda (f g) (lambda (x) (f (g x)))))","");
  read((int)&local_2c8,local_338,__nbytes_11);
  local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_118);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_11);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_118.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"((compose list twice) 5)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"((compose list twice) 5)","")
  ;
  read((int)&local_2c8,local_338,__nbytes_12);
  local_128.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_128.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_128);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_12);
  test_equal_<std::__cxx11::string,char[5]>
            (&local_318,&local_2f8,(char (*) [5])"(10)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_128.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define repeat (lambda (f) (compose f f)))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define repeat (lambda (f) (compose f f)))","");
  read((int)&local_2c8,local_338,__nbytes_13);
  local_138.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_138.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_138);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_13);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_138.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"((repeat twice) 5)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"((repeat twice) 5)","");
  read((int)&local_2c8,local_338,__nbytes_14);
  local_148.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_148.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_148);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_14);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_318,&local_2f8,(char (*) [3])"20",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_148.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"((repeat (repeat twice)) 5)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"((repeat (repeat twice)) 5)","");
  read((int)&local_2c8,local_338,__nbytes_15);
  local_158.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_158.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_158);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_15);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_318,&local_2f8,(char (*) [3])"80",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_158.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))",
             "");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))",
             "");
  read((int)&local_2c8,local_338,__nbytes_16);
  local_168.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_168.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_168);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_16);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_168.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(fact 3)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(fact 3)","");
  read((int)&local_2c8,local_338,__nbytes_17);
  local_178.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_178.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_178);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_17);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_318,&local_2f8,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_178.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"(fact 12)","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"(fact 12)","");
  read((int)&local_2c8,local_338,__nbytes_18);
  local_188.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_188.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_188);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_18);
  test_equal_<std::__cxx11::string,char[10]>
            (&local_318,&local_2f8,(char (*) [10])"479001600",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x332);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_188.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))","");
  read((int)&local_2c8,local_338,__nbytes_19);
  local_198.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_198.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_198);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_19);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x333);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_198.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(list (abs -3) (abs 0) (abs 3))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(list (abs -3) (abs 0) (abs 3))","");
  read((int)&local_2c8,local_338,__nbytes_20);
  local_1a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1a8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_20);
  test_equal_<std::__cxx11::string,char[8]>
            (&local_318,&local_2f8,(char (*) [8])"(3 0 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x334);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,"");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,"");
  read((int)&local_2c8,local_338,__nbytes_21);
  local_1b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1b8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_21);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(define zip (combine cons))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(define zip (combine cons))","");
  read((int)&local_2c8,local_338,__nbytes_22);
  local_1c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1c8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_22);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(zip (list 1 2 3 4) (list 5 6 7 8))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(zip (list 1 2 3 4) (list 5 6 7 8))","");
  read((int)&local_2c8,local_338,__nbytes_23);
  local_1d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1d8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_23);
  test_equal_<std::__cxx11::string,char[26]>
            (&local_318,&local_2f8,(char (*) [26])"((1 5) (2 6) (3 7) (4 8))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,"");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,"");
  read((int)&local_2c8,local_338,__nbytes_24);
  local_1e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1e8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_24);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_318,&local_2f8,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x342);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"(riff-shuffle (list 1 2 3 4 5 6 7 8))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"(riff-shuffle (list 1 2 3 4 5 6 7 8))","");
  read((int)&local_2c8,local_338,__nbytes_25);
  local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_1f8);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_25);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_318,&local_2f8,(char (*) [18])"(1 5 2 6 3 7 4 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x343);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))","");
  read((int)&local_2c8,local_338,__nbytes_26);
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_208);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_26);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_318,&local_2f8,(char (*) [18])"(1 3 5 7 2 4 6 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x344);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_208.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,
             "(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,
             "(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))","");
  read((int)&local_2c8,local_338,__nbytes_27);
  local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_2d8;
  local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_2d0._M_pi;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2d0._M_pi)->_M_use_count = (local_2d0._M_pi)->_M_use_count + 1;
    }
  }
  eval(&local_270,&local_2c8,&local_218);
  to_string_abi_cxx11_(&local_2f8,(scheme *)&local_270,exp_27);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_318,&local_2f8,(char (*) [18])"(1 2 3 4 5 6 7 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x345);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_270.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_270.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != paVar3) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_218.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_2c8.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != paVar4) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total tests ",0xc);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", total failures ",0x11);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  iVar5 = g_fault_count;
  if (local_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d0._M_pi);
  }
  return (uint)(iVar5 != 0);
}

Assistant:

unsigned do_scheme_complete_test() {
	env_p global_env(new environment()); add_globals(global_env);
	// the 29 unit tests for lis.py
	TEST("(quote (testing 1 (2.0) -3.14e159))", "(testing 1 (2.0) -3.14e159)");
	TEST("(+ 2 2)", "4");
	TEST("(+ (* 2 100) (* 1 10))", "210");
	TEST("(if (> 6 5) (+ 1 1) (+ 2 2))", "2");
	TEST("(if (< 6 5) (+ 1 1) (+ 2 2))", "4");
	TEST("(define x 3)", "3");
	TEST("x", "3");
	TEST("(+ x x)", "6");
	TEST("(begin (define x 1) (set! x (+ x 1)) (+ x 1))", "3");
	TEST("((lambda (x) (+ x x)) 5)", "10");
	TEST("(define twice (lambda (x) (* 2 x)))", "<Lambda>");
	TEST("(twice 5)", "10");
	TEST("(define compose (lambda (f g) (lambda (x) (f (g x)))))", "<Lambda>");
	TEST("((compose list twice) 5)", "(10)");
	TEST("(define repeat (lambda (f) (compose f f)))", "<Lambda>");
	TEST("((repeat twice) 5)", "20");
	TEST("((repeat (repeat twice)) 5)", "80");
	TEST("(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))", "<Lambda>");
	TEST("(fact 3)", "6");
	//TEST("(fact 50)", "30414093201713378043612608166064768844377641568960512000000000000");
	TEST("(fact 12)", "479001600"); // no bignums; this is as far as we go with 32 bits
	TEST("(define abs (lambda (n) ((if (> n 0) + -) 0 n)))", "<Lambda>");
	TEST("(list (abs -3) (abs 0) (abs 3))", "(3 0 3)");
	//TEST("(define x (lambda (n) (+ n 1)))", "<Lambda>");
	//TEST("(list (x 4) (x 4) (x 4))", "(5 5 5)");
	TEST("(define combine (lambda (f)"
		"(lambda (x y)"
		"(if (null? x) (quote ())"
		"(f (list (head x) (head y))"
		"((combine f) (tail x) (tail y)))))))", "<Lambda>");
	TEST("(define zip (combine cons))", "<Lambda>");
	TEST("(zip (list 1 2 3 4) (list 5 6 7 8))", "((1 5) (2 6) (3 7) (4 8))");
	TEST("(define riff-shuffle (lambda (deck) (begin"
		"(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))"
		"(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))"
		"(define mid (lambda (seq) (/ (length seq) 2)))"
		"((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))", "<Lambda>");
	TEST("(riff-shuffle (list 1 2 3 4 5 6 7 8))", "(1 5 2 6 3 7 4 8)");
	TEST("((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))", "(1 3 5 7 2 4 6 8)");
	TEST("(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))", "(1 2 3 4 5 6 7 8)");
	std::cout
		<< "total tests " << g_test_count
		<< ", total failures " << g_fault_count
		<< "\n";
	return g_fault_count ? EXIT_FAILURE : EXIT_SUCCESS;
}